

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::clear(Value *this)

{
  ValueType VVar1;
  String local_1b8;
  ostringstream local_188 [8];
  OStringStream oss;
  Value *this_local;
  
  VVar1 = type(this);
  if (((VVar1 != nullValue) && (VVar1 = type(this), VVar1 != arrayValue)) &&
     (VVar1 = type(this), VVar1 != objectValue)) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188,"in Json::Value::clear(): requires complex value");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1b8);
  }
  this->start_ = 0;
  this->limit_ = 0;
  VVar1 = type(this);
  if (VVar1 == arrayValue || VVar1 == objectValue) {
    std::
    map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::clear((this->value_).map_);
  }
  return;
}

Assistant:

void Value::clear() {
  JSON_ASSERT_MESSAGE(type() == nullValue || type() == arrayValue ||
                          type() == objectValue,
                      "in Json::Value::clear(): requires complex value");
  start_ = 0;
  limit_ = 0;
  switch (type()) {
  case arrayValue:
  case objectValue:
    value_.map_->clear();
    break;
  default:
    break;
  }
}